

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O0

bool ON_MD5::Validate(void)

{
  bool bVar1;
  int iVar2;
  ON__UINT32 OVar3;
  ON__UINT64 OVar4;
  undefined1 local_bd0 [8];
  ON_MD5_Hash md5_digestx;
  size_t count;
  size_t min_count;
  ON_RandomNumberGenerator rng;
  ON_MD5_Hash md5_digest;
  size_t total_count;
  ON_MD5 md5;
  size_t i;
  size_t a_count;
  ON__UINT8 a [200];
  size_t one_million;
  ON__UINT8 millionXa [16];
  ON__UINT8 quickfoxperiod [16];
  ON__UINT8 quickfox [16];
  ON__UINT8 abc_x [16];
  ON__UINT8 abc [16];
  ON__UINT8 empty_string [16];
  
  abc[8] = 0xd4;
  abc[9] = '\x1d';
  abc[10] = 0x8c;
  abc[0xb] = 0xd9;
  abc[0xc] = 0x8f;
  abc[0xd] = '\0';
  abc[0xe] = 0xb2;
  abc[0xf] = '\x04';
  bVar1 = MD5_ValidateHelper("",abc + 8);
  if ((bVar1) && (iVar2 = memcmp(&ON_MD5_Hash::EmptyContentHash,abc + 8,0x10), iVar2 == 0)) {
    abc_x[8] = 0x90;
    abc_x[9] = '\x01';
    abc_x[10] = 'P';
    abc_x[0xb] = 0x98;
    abc_x[0xc] = '<';
    abc_x[0xd] = 0xd2;
    abc_x[0xe] = 'O';
    abc_x[0xf] = 0xb0;
    abc[0] = 0xd6;
    abc[1] = 0x96;
    abc[2] = '?';
    abc[3] = '}';
    abc[4] = '(';
    abc[5] = 0xe1;
    abc[6] = '\x7f';
    abc[7] = 'r';
    bVar1 = MD5_ValidateHelper("abc",abc_x + 8);
    if (bVar1) {
      quickfox[8] = 0x82;
      quickfox[9] = '\x15';
      quickfox[10] = 0xef;
      quickfox[0xb] = '\a';
      quickfox[0xc] = 0x96;
      quickfox[0xd] = 0xa2;
      quickfox[0xe] = '\v';
      quickfox[0xf] = 0xca;
      abc_x[0] = 0xaa;
      abc_x[1] = 0xe1;
      abc_x[2] = '\x16';
      abc_x[3] = 0xd3;
      abc_x[4] = 0x87;
      abc_x[5] = 'l';
      abc_x[6] = 'f';
      abc_x[7] = 'J';
      bVar1 = MD5_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
                                 quickfox + 8);
      if (bVar1) {
        quickfoxperiod[8] = 0x9e;
        quickfoxperiod[9] = '\x10';
        quickfoxperiod[10] = '}';
        quickfoxperiod[0xb] = 0x9d;
        quickfoxperiod[0xc] = '7';
        quickfoxperiod[0xd] = '+';
        quickfoxperiod[0xe] = 0xb6;
        quickfoxperiod[0xf] = 0x82;
        quickfox[0] = 'k';
        quickfox[1] = 0xd8;
        quickfox[2] = '\x1d';
        quickfox[3] = '5';
        quickfox[4] = 'B';
        quickfox[5] = 0xa4;
        quickfox[6] = '\x19';
        quickfox[7] = 0xd6;
        bVar1 = MD5_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfoxperiod + 8)
        ;
        if (bVar1) {
          millionXa[8] = 0xe4;
          millionXa[9] = 0xd9;
          millionXa[10] = '\t';
          millionXa[0xb] = 0xc2;
          millionXa[0xc] = 0x90;
          millionXa[0xd] = 0xd0;
          millionXa[0xe] = 0xfb;
          millionXa[0xf] = '\x1c';
          quickfoxperiod[0] = 0xa0;
          quickfoxperiod[1] = 'h';
          quickfoxperiod[2] = 0xff;
          quickfoxperiod[3] = 0xad;
          quickfoxperiod[4] = 0xdf;
          quickfoxperiod[5] = '\"';
          quickfoxperiod[6] = 0xcb;
          quickfoxperiod[7] = 0xd0;
          bVar1 = MD5_ValidateHelper("The quick brown fox jumps over the lazy dog.",millionXa + 8);
          if (bVar1) {
            one_million = 0x707c024eaed60777;
            millionXa[0] = 0xee;
            millionXa[1] = 0xa2;
            millionXa[2] = 0xa9;
            millionXa[3] = '5';
            millionXa[4] = 0xc2;
            millionXa[5] = ')';
            millionXa[6] = 'o';
            millionXa[7] = '!';
            builtin_memcpy(a + 0xc0,"@B\x0f",4);
            a[0xc4] = '\0';
            a[0xc5] = '\0';
            a[0xc6] = '\0';
            a[199] = '\0';
            md5.m_md5_hash.m_digest[8] = '\0';
            md5.m_md5_hash.m_digest[9] = '\0';
            md5.m_md5_hash.m_digest[10] = '\0';
            md5.m_md5_hash.m_digest[0xb] = '\0';
            md5.m_md5_hash.m_digest[0xc] = '\0';
            md5.m_md5_hash.m_digest[0xd] = '\0';
            md5.m_md5_hash.m_digest[0xe] = '\0';
            md5.m_md5_hash.m_digest[0xf] = '\0';
            for (; (ulong)md5.m_md5_hash.m_digest._8_8_ < 200;
                md5.m_md5_hash.m_digest._8_8_ = md5.m_md5_hash.m_digest._8_8_ + 1) {
              a[md5.m_md5_hash.m_digest._8_8_ + -8] = 'a';
            }
            ON_MD5((ON_MD5 *)&total_count);
            md5_digest.m_digest[8] = '\0';
            md5_digest.m_digest[9] = '\0';
            md5_digest.m_digest[10] = '\0';
            md5_digest.m_digest[0xb] = '\0';
            md5_digest.m_digest[0xc] = '\0';
            md5_digest.m_digest[0xd] = '\0';
            md5_digest.m_digest[0xe] = '\0';
            md5_digest.m_digest[0xf] = '\0';
            for (; (ulong)md5_digest.m_digest._8_8_ < 1000000;
                md5_digest.m_digest._8_8_ = md5_digest.m_digest._8_8_ + 200) {
              AccumulateBytes((ON_MD5 *)&total_count,&a_count,200);
              OVar4 = ByteCount((ON_MD5 *)&total_count);
              if (OVar4 != md5_digest.m_digest._8_8_ + 200) {
                return false;
              }
            }
            join_0x00000010_0x00000000_ = Hash((ON_MD5 *)&total_count);
            iVar2 = memcmp(rng.m_rand_context.mt + 0x26e,&one_million,0x10);
            if (iVar2 == 0) {
              Reset((ON_MD5 *)&total_count);
              ON_RandomNumberGenerator::ON_RandomNumberGenerator
                        ((ON_RandomNumberGenerator *)((long)&min_count + 4));
              md5_digest.m_digest[8] = '\0';
              md5_digest.m_digest[9] = '\0';
              md5_digest.m_digest[10] = '\0';
              md5_digest.m_digest[0xb] = '\0';
              md5_digest.m_digest[0xc] = '\0';
              md5_digest.m_digest[0xd] = '\0';
              md5_digest.m_digest[0xe] = '\0';
              md5_digest.m_digest[0xf] = '\0';
              do {
                if (999999 < (ulong)md5_digest.m_digest._8_8_) {
                  _local_bd0 = Hash((ON_MD5 *)&total_count);
                  iVar2 = memcmp(local_bd0,&one_million,0x10);
                  if (iVar2 == 0) {
                    return true;
                  }
                  return false;
                }
                OVar3 = ON_RandomNumberGenerator::RandomNumber
                                  ((ON_RandomNumberGenerator *)((long)&min_count + 4));
                md5_digestx.m_digest._8_8_ = (ulong)OVar3 % 100 + 100;
                if (1000000 < (ulong)(md5_digest.m_digest._8_8_ + md5_digestx.m_digest._8_8_)) {
                  md5_digestx.m_digest._8_8_ = 1000000 - md5_digest.m_digest._8_8_;
                }
                AccumulateBytes((ON_MD5 *)&total_count,&a_count,md5_digestx.m_digest._8_8_);
                md5_digest.m_digest._8_8_ = md5_digestx.m_digest._8_8_ + md5_digest.m_digest._8_8_;
                OVar4 = ByteCount((ON_MD5 *)&total_count);
              } while (OVar4 == md5_digest.m_digest._8_8_);
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_MD5::Validate()
{
  // http://onlinemd5.com/

  // "" (empty string)
  // d41d8cd9 8f00b204 e9800998 ecf8427e
  const ON__UINT8 empty_string[16] = {
    0xd4, 0x1d, 0x8c, 0xd9,
    0x8f, 0x00, 0xb2, 0x04,
    0xe9, 0x80, 0x09, 0x98,
    0xec, 0xf8, 0x42, 0x7e };
  if (false == MD5_ValidateHelper("",empty_string))
    return false;

  
  if (0 != memcmp(&ON_MD5_Hash::EmptyContentHash ,empty_string, sizeof(empty_string)))
    return false;

  // "abc"
  // 90015098 3CD24FB0 D6963F7D 28E17F72
  const ON__UINT8 abc[16]  = { 
    0x90, 0x01, 0x50, 0x98,
    0x3C, 0xD2, 0x4F, 0xB0,
    0xD6, 0x96, 0x3F, 0x7D,
    0x28, 0xE1, 0x7F, 0x72  };
  if (false == MD5_ValidateHelper("abc",abc))
    return false;

  // "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq"
  // 8215EF07 96A20BCA AAE116D3 876C664A
  const ON__UINT8 abc_x[16] = { 
    0x82, 0x15, 0xEF, 0x07,
    0x96, 0xA2, 0x0B, 0xCA,
    0xAA, 0xE1, 0x16, 0xD3,
    0x87, 0x6C, 0x66, 0x4A };
  if (false == MD5_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",abc_x))
    return false;

  // "The quick brown fox jumps over the lazy dog"
  // 9E107D9D 372BB682 6BD81D35 42A419D6
  const ON__UINT8 quickfox[16] = {
    0x9E, 0x10, 0x7D, 0x9D,
    0x37, 0x2B, 0xB6, 0x82,
    0x6B, 0xD8, 0x1D, 0x35,
    0x42, 0xA4, 0x19, 0xD6 };
  if (false == MD5_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfox))
    return false;

  // "The quick brown fox jumps over the lazy dog."
  // E4D909C2 90D0FB1C A068FFAD DF22CBD0
  const ON__UINT8 quickfoxperiod[16] = {
    0xE4, 0xD9, 0x09, 0xC2,
    0x90, 0xD0, 0xFB, 0x1C,
    0xA0, 0x68, 0xFF, 0xAD,
    0xDF, 0x22, 0xCB, 0xD0 };
  if (false == MD5_ValidateHelper("The quick brown fox jumps over the lazy dog.",quickfoxperiod))
    return false;

  // 1,000,000 repetitions of the character "a".
  // 7707D6AE 4E027C70 EEA2A935 C2296F21.
  const ON__UINT8 millionXa[16] = {
    0x77, 0x07, 0xD6, 0xAE,
    0x4E, 0x02, 0x7C, 0x70,
    0xEE, 0xA2, 0xA9, 0x35,
    0xC2, 0x29, 0x6F, 0x21 };

  const size_t one_million = 1000000;
  ON__UINT8 a[200];
  const size_t a_count = sizeof(a) / sizeof(a[0]);
  for ( size_t i = 0; i < a_count; i++)
    a[i] = 'a';  
  ON_MD5 md5;
  size_t total_count = 0;
  for (total_count = 0; total_count < one_million; total_count += a_count)
  {
    md5.AccumulateBytes(a, a_count);
    if (md5.ByteCount() != (ON__UINT64)(total_count+a_count))
      return false;
  }
  
  ON_MD5_Hash md5_digest(md5.Hash());

  if (0 != memcmp(&md5_digest,millionXa,sizeof(millionXa)))
    return false;

  md5.Reset();
  ON_RandomNumberGenerator rng;
  total_count = 0; 
  const size_t min_count = (a_count >= 10000) ? a_count/1000 : 100;
  while (total_count < one_million)
  {
    size_t count = min_count + (rng.RandomNumber() % (ON__UINT32)min_count);
    if ( total_count + count > one_million )
      count = one_million - total_count;
    md5.AccumulateBytes(a, count);
    total_count += count;
    if (md5.ByteCount() != (ON__UINT64)total_count)
      return false;
  }

  ON_MD5_Hash md5_digestx(md5.Hash());
  if (0 != memcmp(&md5_digestx,millionXa,sizeof(millionXa)))
    return false;


  return true;
}